

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>
::insert<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>&>
          (HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>
           *this,vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                 *args)

{
  undefined8 *puVar1;
  byte bVar2;
  u8 uVar3;
  long lVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pSVar7;
  bool bVar8;
  ulong uVar9;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_51;
  ulong local_50;
  vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_> local_48;
  ulong local_28;
  ulong local_20;
  
  std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>::vector
            (&local_48,args);
  bVar8 = HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
          ::findPosition((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                          *)this,&local_48,&local_51,&local_20,&local_28,&local_50);
  if (bVar8) {
    bVar8 = false;
  }
  else if ((*(ulong *)(this + 0x20) == *(long *)(this + 0x10) * 7 + 7U >> 3) ||
          (local_50 == local_28)) {
    HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
    ::growTable((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                 *)this);
    bVar8 = insert<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>>
                      (this,(HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                             *)&local_48);
  }
  else {
    lVar4 = *(long *)this;
    *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
    do {
      bVar2 = *(byte *)(*(long *)(this + 8) + local_50);
      if (-1 < (char)bVar2) {
        *(u8 *)(*(long *)(this + 8) + local_50) = local_51;
        puVar1 = (undefined8 *)(lVar4 + local_50 * 0x18);
        *puVar1 = local_48.
                  super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar1[1] = local_48.
                    super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)(lVar4 + 0x10 + local_50 * 0x18) =
             local_48.
             super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_48.
        super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar8 = true;
        goto LAB_002ce7e6;
      }
      uVar9 = (ulong)((int)local_50 - (uint)bVar2 & 0x7f);
      if (uVar9 < (local_50 - local_20 & *(ulong *)(this + 0x10))) {
        puVar1 = (undefined8 *)(lVar4 + local_50 * 0x18);
        pSVar6 = (pointer)*puVar1;
        pSVar7 = (pointer)puVar1[1];
        pSVar5 = *(pointer *)(lVar4 + 0x10 + local_50 * 0x18);
        *(undefined8 *)(lVar4 + local_50 * 0x18) = 0;
        puVar1 = (undefined8 *)(lVar4 + 8 + local_50 * 0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)(lVar4 + local_50 * 0x18);
        *puVar1 = local_48.
                  super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar1[1] = local_48.
                    super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)(lVar4 + 0x10 + local_50 * 0x18) =
             local_48.
             super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        uVar3 = *(u8 *)(*(long *)(this + 8) + local_50);
        *(u8 *)(*(long *)(this + 8) + local_50) = local_51;
        local_20 = local_50 - uVar9 & *(ulong *)(this + 0x10);
        local_28 = local_20 + 0x7f & *(ulong *)(this + 0x10);
        local_51 = uVar3;
        local_48.
        super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = pSVar6;
        local_48.
        super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar7;
        local_48.
        super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar5;
      }
      local_50 = local_50 + 1 & *(ulong *)(this + 0x10);
    } while (local_50 != local_28);
    HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
    ::growTable((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                 *)this);
    bVar8 = true;
    insert<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>>
              (this,(HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                     *)&local_48);
  }
LAB_002ce7e6:
  if (local_48.
      super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }